

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::AdvGraphicsTestInstance::~AdvGraphicsTestInstance
          (AdvGraphicsTestInstance *this)

{
  VkBuffer obj;
  Allocation *pAVar1;
  
  (this->super_BasicGraphicsTestInstance).super_TimestampTestInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__AdvGraphicsTestInstance_00d20328;
  obj.m_internal =
       (this->m_indirectBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_indirectBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                deleter,obj);
  }
  (this->m_indirectBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_indirectBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_indirectBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       0;
  (this->m_indirectBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  pAVar1 = (this->m_indirectBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar1 != (Allocation *)0x0) {
    (*pAVar1->_vptr_Allocation[1])();
    (this->m_indirectBufferAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  BasicGraphicsTestInstance::~BasicGraphicsTestInstance(&this->super_BasicGraphicsTestInstance);
  return;
}

Assistant:

AdvGraphicsTestInstance::~AdvGraphicsTestInstance(void)
{
}